

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::aggregate_formatter::~aggregate_formatter(aggregate_formatter *this)

{
  std::__cxx11::string::~string((string *)&this->str_);
  operator_delete(this);
  return;
}

Assistant:

aggregate_formatter() = default;